

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hvtool.cpp
# Opt level: O0

void __thiscall dumper::dumpkeys(dumper *this,uint32_t id,string *path)

{
  uint32_t uVar1;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  key *local_28;
  key *k;
  string *path_local;
  dumper *pdStack_10;
  uint32_t id_local;
  dumper *this_local;
  
  k = (key *)path;
  path_local._4_4_ = id;
  pdStack_10 = this;
  while (path_local._4_4_ != 0) {
    local_28 = getkey(this,path_local._4_4_);
    (*this->_vptr_dumper[3])(this,local_28,k);
    uVar1 = ent::key::firstvalue(local_28);
    dumpvalues(this,uVar1);
    uVar1 = ent::key::firstchild(local_28);
    std::operator+(&local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)k,
                   "\\");
    ent::key::name_abi_cxx11_(&local_88,local_28);
    std::operator+(&local_48,&local_68,&local_88);
    dumpkeys(this,uVar1,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_68);
    path_local._4_4_ = ent::key::nextsibling(local_28);
  }
  return;
}

Assistant:

void dumpkeys(uint32_t id, const std::string& path)
    {
        while (id)
        {
            ent::key *k= getkey(id);
            dumpkey(k, path);
            dumpvalues(k->firstvalue());
            dumpkeys(k->firstchild(), path+"\\"+k->name());
            id= k->nextsibling();
        }
    }